

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

void __thiscall
ear::PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_>::run
          (PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *this,PolarExtentCoreContext *ctx)

{
  size_t sVar1;
  extent_float_t *peVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *position;
  size_t speaker_idx;
  size_t sVar6;
  PolarExtentCoreContext *mem;
  ulong uVar7;
  size_t speaker_idx_1;
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *pPVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 in_ZMM0 [64];
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> pos;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  simd_register<float,_xsimd::avx> local_e0;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  sVar1 = ctx->num_speakers;
  position = (PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *)ctx->results;
  for (sVar6 = 0; sVar1 != sVar6; sVar6 = sVar6 + 1) {
    (position->x).super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
    super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[sVar6] = 0.0
    ;
  }
  mem = ctx;
  for (pPVar8 = (PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *)0x0;
      auVar12 = in_ZMM0._0_32_,
      pPVar8 < (PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *)ctx->num_points;
      pPVar8 = (PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *)
               ((pPVar8->x).super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
                super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data
               + 2)) {
    xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::load_aligned<float>
              ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)(ctx->xs + (long)pPVar8),(float *)mem);
    local_c0 = auVar12;
    xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::load_aligned<float>
              ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)(ctx->ys + (long)pPVar8),(float *)mem);
    local_a0 = auVar12;
    xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::load_aligned<float>
              ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)(ctx->zs + (long)pPVar8),(float *)mem);
    local_80 = auVar12;
    if (ctx->is_circular == true) {
      mem = ctx;
      weight_circle((batch *)this,(PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *)ctx,
                    (PolarExtentCoreContext *)local_c0,position);
    }
    else {
      mem = ctx;
      weight_stadium((batch *)this,(PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *)ctx,
                     (PolarExtentCoreContext *)local_c0,position);
    }
    local_e0.data = (register_type)vcmpps_avx(auVar12,_DAT_001baaa0,0);
    bVar4 = xsimd::all<float,xsimd::fma3<xsimd::avx2>>
                      ((batch_bool<float,_xsimd::fma3<xsimd::avx2>_> *)&local_e0);
    auVar11._8_4_ = 0x3f800000;
    auVar11._0_8_ = 0x3f8000003f800000;
    auVar11._12_4_ = 0x3f800000;
    auVar11._16_4_ = 0x3f800000;
    auVar11._20_4_ = 0x3f800000;
    auVar11._24_4_ = 0x3f800000;
    auVar11._28_4_ = 0x3f800000;
    local_e0.data = (register_type)vcmpps_avx(auVar11,auVar12,0);
    in_ZMM0 = ZEXT1664(local_e0.data._0_16_);
    bVar5 = xsimd::all<float,xsimd::fma3<xsimd::avx2>>
                      ((batch_bool<float,_xsimd::fma3<xsimd::avx2>_> *)&local_e0);
    if (bVar5) {
      lVar9 = 0;
      uVar7 = 0;
      while( true ) {
        auVar12 = in_ZMM0._0_32_;
        if (ctx->num_speakers <= uVar7) break;
        xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::load_aligned<float>
                  ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)
                   ((long)ctx->summed_panning_results +
                   lVar9 + ctx->num_speakers * ((ulong)pPVar8 >> 3) * 4),(float *)mem);
        peVar2 = ctx->results;
        auVar11 = auVar12;
        xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::load_aligned<float>
                  ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)((long)peVar2 + lVar9),(float *)mem);
        local_100 = auVar12._0_4_;
        fStack_fc = auVar12._4_4_;
        fStack_f8 = auVar12._8_4_;
        fStack_f4 = auVar12._12_4_;
        fStack_f0 = auVar12._16_4_;
        fStack_ec = auVar12._20_4_;
        fStack_e8 = auVar12._24_4_;
        fStack_e4 = auVar12._28_4_;
        auVar12._0_4_ = auVar11._0_4_ + local_100;
        auVar12._4_4_ = auVar11._4_4_ + fStack_fc;
        auVar12._8_4_ = auVar11._8_4_ + fStack_f8;
        auVar12._12_4_ = auVar11._12_4_ + fStack_f4;
        auVar12._16_4_ = auVar11._16_4_ + fStack_f0;
        auVar12._20_4_ = auVar11._20_4_ + fStack_ec;
        auVar12._24_4_ = auVar11._24_4_ + fStack_e8;
        auVar12._28_4_ = auVar11._28_4_ + fStack_e4;
        in_ZMM0 = ZEXT3264(auVar12);
        *(undefined1 (*) [32])((long)peVar2 + lVar9) = auVar12;
        uVar7 = uVar7 + 8;
        lVar9 = lVar9 + 0x20;
      }
    }
    else if (!bVar4) {
      for (uVar7 = 0; auVar11 = in_ZMM0._28_32_, uVar7 < ctx->real_num_speakers; uVar7 = uVar7 + 1)
      {
        position = pPVar8;
        xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::load_aligned<float>
                  ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)
                   (ctx->panning_results +
                   (long)((long)(pPVar8->x).super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
                                super_simd_register<float,_xsimd::avx2>.
                                super_simd_register<float,_xsimd::avx>.data +
                         ctx->num_points * uVar7)),(float *)mem);
        local_100 = auVar12._0_4_;
        fStack_fc = auVar12._4_4_;
        fStack_f8 = auVar12._8_4_;
        fStack_f4 = auVar12._12_4_;
        fStack_f0 = auVar12._16_4_;
        fStack_e8 = auVar12._24_4_;
        fStack_fc = auVar11._4_4_ * fStack_fc;
        auVar10._0_4_ = auVar11._0_4_ * local_100 + auVar11._16_4_ * fStack_f0;
        auVar10._4_4_ = fStack_fc + fStack_fc;
        auVar10._8_4_ = auVar11._8_4_ * fStack_f8 + auVar11._24_4_ * fStack_e8;
        auVar10._12_4_ = auVar11._12_4_ * fStack_f4 + auVar11._28_4_;
        auVar10 = vhaddps_avx(auVar10,auVar10);
        auVar10 = vhaddps_avx(auVar10,auVar10);
        fVar3 = auVar10._0_4_ + ctx->results[uVar7];
        in_ZMM0 = ZEXT464((uint)fVar3);
        ctx->results[uVar7] = fVar3;
      }
    }
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i += batch::size) {
        PositionBatch<batch> pos;
        pos.x = batch::load_aligned(ctx.xs + i);
        pos.y = batch::load_aligned(ctx.ys + i);
        pos.z = batch::load_aligned(ctx.zs + i);

        batch weight = ctx.is_circular ? weight_circle(ctx, pos)
                                       : weight_stadium(ctx, pos);

        bool all_zeros = xsimd::all(weight == 0.0);
        bool all_ones = xsimd::all(weight == 1.0);
        if (all_ones) {
          // add pre-computed sum for this batch
          size_t batch_i = i / batch::size;
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx += batch::size) {
            batch gain =
                batch::load_aligned(ctx.summed_panning_results +
                                    (batch_i * ctx.num_speakers) + speaker_idx);

            extent_float_t *result_ptr = ctx.results + speaker_idx;
            xsimd::store_aligned(result_ptr,
                                 batch::load_aligned(result_ptr) + gain);
          }
        } else if (!all_zeros) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.real_num_speakers;
               speaker_idx++) {
            batch gain = batch::load_aligned(ctx.panning_results +
                                             speaker_idx * ctx.num_points + i);
            ctx.results[speaker_idx] += xsimd::reduce_add(gain * weight);
          }
        }
      }
    }